

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O1

void av1_calc_proj_params_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int64_t aiVar5 [2];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  ulong uVar8;
  long lVar9;
  long lVar10;
  int64_t aiVar11 [2];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar14 [64];
  undefined1 auVar20 [64];
  
  if (params->r[0] < 1) {
LAB_0049273c:
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    }
    else {
      auVar14 = ZEXT1664((undefined1  [16])0x0);
      uVar8 = 0;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        if (0 < width) {
          lVar10 = 0;
          do {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(dat8 + lVar10);
            auVar13 = vpmovzxbd_avx2(auVar6);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(src8 + lVar10);
            auVar16 = vpmovzxbd_avx2(auVar4);
            auVar23 = vpslld_avx2(auVar13,4);
            auVar19 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar10),auVar23);
            auVar13 = vpsubd_avx2(auVar16,auVar13);
            auVar15 = vpslld_avx2(auVar13,4);
            auVar13 = vpmuldq_avx2(auVar19,auVar19);
            auVar13 = vpaddq_avx2(auVar14._0_32_,auVar13);
            auVar23 = vpshufd_avx2(auVar19,0xf5);
            auVar16 = vpmuldq_avx2(auVar23,auVar23);
            auVar13 = vpaddq_avx2(auVar16,auVar13);
            auVar14 = ZEXT3264(auVar13);
            auVar13 = vpmuldq_avx2(auVar15,auVar19);
            auVar13 = vpaddq_avx2(auVar17._0_32_,auVar13);
            auVar16 = vpsrlq_avx2(auVar15,0x20);
            auVar16 = vpmuldq_avx2(auVar16,auVar23);
            auVar13 = vpaddq_avx2(auVar16,auVar13);
            auVar17 = ZEXT3264(auVar13);
            lVar10 = lVar10 + 8;
          } while (lVar10 < width);
        }
        auVar16 = auVar17._0_32_;
        auVar13 = auVar14._0_32_;
        uVar8 = uVar8 + 1;
        flt1 = flt1 + flt1_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      } while (uVar8 != (uint)height);
    }
    auVar1 = vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
    auVar12 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddq_avx(auVar1,auVar12);
    auVar12 = vpaddq_avx(auVar16._16_16_,auVar16._0_16_);
    auVar6 = vpshufd_avx(auVar12,0xee);
    auVar12 = vpaddq_avx(auVar12,auVar6);
    auVar12 = vpslldq_avx(auVar12,8);
    aiVar11 = (int64_t  [2])vpslldq_avx(auVar1,8);
    *(undefined1 (*) [16])C = auVar12;
    H[1] = aiVar11;
    lVar9 = (long)(height * width);
    H[1][1] = H[1][1] / lVar9;
  }
  else {
    if (params->r[1] < 1) {
      if (0 < params->r[0]) {
        if (height < 1) {
          auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        }
        else {
          auVar14 = ZEXT1664((undefined1  [16])0x0);
          uVar8 = 0;
          auVar17 = ZEXT1664((undefined1  [16])0x0);
          do {
            if (0 < width) {
              lVar10 = 0;
              do {
                auVar2._8_8_ = 0;
                auVar2._0_8_ = *(ulong *)(dat8 + lVar10);
                auVar13 = vpmovzxbd_avx2(auVar2);
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *(ulong *)(src8 + lVar10);
                auVar16 = vpmovzxbd_avx2(auVar3);
                auVar23 = vpslld_avx2(auVar13,4);
                auVar19 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar10),auVar23);
                auVar13 = vpsubd_avx2(auVar16,auVar13);
                auVar15 = vpslld_avx2(auVar13,4);
                auVar13 = vpmuldq_avx2(auVar19,auVar19);
                auVar13 = vpaddq_avx2(auVar14._0_32_,auVar13);
                auVar23 = vpshufd_avx2(auVar19,0xf5);
                auVar16 = vpmuldq_avx2(auVar23,auVar23);
                auVar13 = vpaddq_avx2(auVar16,auVar13);
                auVar14 = ZEXT3264(auVar13);
                auVar13 = vpmuldq_avx2(auVar15,auVar19);
                auVar13 = vpaddq_avx2(auVar17._0_32_,auVar13);
                auVar16 = vpsrlq_avx2(auVar15,0x20);
                auVar16 = vpmuldq_avx2(auVar16,auVar23);
                auVar13 = vpaddq_avx2(auVar16,auVar13);
                auVar17 = ZEXT3264(auVar13);
                lVar10 = lVar10 + 8;
              } while (lVar10 < width);
            }
            auVar16 = auVar17._0_32_;
            auVar13 = auVar14._0_32_;
            uVar8 = uVar8 + 1;
            flt0 = flt0 + flt0_stride;
            src8 = src8 + src_stride;
            dat8 = dat8 + dat_stride;
          } while (uVar8 != (uint)height);
        }
        auVar1 = vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
        auVar12 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddq_avx(auVar1,auVar12);
        auVar12 = vpaddq_avx(auVar16._16_16_,auVar16._0_16_);
        auVar6 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpaddq_avx(auVar12,auVar6);
        *C = auVar12._0_8_;
        C[1] = 0;
        (*H)[0] = auVar1._0_8_;
        (*H)[1] = 0;
        lVar9 = (long)(height * width);
        (*H)[0] = (*H)[0] / lVar9;
        goto LAB_0049283c;
      }
      goto LAB_0049273c;
    }
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = auVar20._0_32_;
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = auVar21._0_32_;
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = auVar17._0_32_;
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = auVar18._0_32_;
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = auVar14._0_32_;
    if (0 < height) {
      uVar8 = 0;
      do {
        if (0 < width) {
          lVar10 = 0;
          do {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)(dat8 + lVar10);
            auVar13 = vpmovzxbd_avx2(auVar1);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(src8 + lVar10);
            auVar16 = vpmovzxbd_avx2(auVar12);
            auVar23 = vpslld_avx2(auVar13,4);
            auVar13 = vpsubd_avx2(auVar16,auVar13);
            auVar22 = vpslld_avx2(auVar13,4);
            auVar15 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar10),auVar23);
            auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar10),auVar23);
            auVar13 = vpmuldq_avx2(auVar15,auVar15);
            auVar13 = vpaddq_avx2(auVar13,auVar14._0_32_);
            auVar23 = vpshufd_avx2(auVar15,0xf5);
            auVar16 = vpmuldq_avx2(auVar23,auVar23);
            auVar13 = vpaddq_avx2(auVar16,auVar13);
            auVar14 = ZEXT3264(auVar13);
            auVar13 = vpmuldq_avx2(auVar7,auVar15);
            auVar13 = vpaddq_avx2(auVar13,auVar18._0_32_);
            auVar19 = vpshufd_avx2(auVar7,0xf5);
            auVar16 = vpmuldq_avx2(auVar19,auVar23);
            auVar13 = vpaddq_avx2(auVar16,auVar13);
            auVar18 = ZEXT3264(auVar13);
            auVar13 = vpmuldq_avx2(auVar7,auVar7);
            auVar13 = vpaddq_avx2(auVar13,auVar17._0_32_);
            auVar16 = vpmuldq_avx2(auVar19,auVar19);
            auVar13 = vpaddq_avx2(auVar16,auVar13);
            auVar17 = ZEXT3264(auVar13);
            auVar13 = vpmuldq_avx2(auVar22,auVar15);
            auVar13 = vpaddq_avx2(auVar21._0_32_,auVar13);
            auVar15 = vpshufd_avx2(auVar22,0xf5);
            auVar16 = vpmuldq_avx2(auVar15,auVar23);
            auVar13 = vpaddq_avx2(auVar16,auVar13);
            auVar21 = ZEXT3264(auVar13);
            auVar13 = vpmuldq_avx2(auVar7,auVar22);
            auVar13 = vpaddq_avx2(auVar20._0_32_,auVar13);
            auVar16 = vpmuldq_avx2(auVar19,auVar15);
            auVar13 = vpaddq_avx2(auVar16,auVar13);
            auVar20 = ZEXT3264(auVar13);
            lVar10 = lVar10 + 8;
          } while (lVar10 < width);
        }
        auVar16 = auVar17._0_32_;
        auVar23 = auVar18._0_32_;
        auVar15 = auVar21._0_32_;
        auVar13 = auVar14._0_32_;
        auVar19 = auVar20._0_32_;
        uVar8 = uVar8 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      } while (uVar8 != (uint)height);
    }
    auVar7 = vpunpcklqdq_avx2(auVar15,auVar19);
    auVar19 = vpunpckhqdq_avx2(auVar15,auVar19);
    auVar19 = vpaddq_avx2(auVar7,auVar19);
    auVar1 = vpaddq_avx(auVar19._16_16_,auVar19._0_16_);
    auVar19 = vpunpcklqdq_avx2(auVar13,auVar23);
    auVar13 = vpunpckhqdq_avx2(auVar13,auVar23);
    auVar13 = vpaddq_avx2(auVar19,auVar13);
    aiVar11 = (int64_t  [2])vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
    auVar23 = vpslldq_avx2(auVar16,8);
    auVar13 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16,0xcc);
    auVar13 = vpaddq_avx2(auVar23,auVar13);
    aiVar5 = (int64_t  [2])vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
    *(undefined1 (*) [16])C = auVar1;
    *H = aiVar11;
    H[1] = aiVar5;
    lVar9 = (long)(height * width);
    lVar10 = (*H)[1];
    (*H)[0] = (*H)[0] / lVar9;
    lVar10 = lVar10 / lVar9;
    (*H)[1] = lVar10;
    H[1][1] = H[1][1] / lVar9;
    H[1][0] = lVar10;
    *C = *C / lVar9;
  }
  C = C + 1;
LAB_0049283c:
  *C = *C / lVar9;
  return;
}

Assistant:

void av1_calc_proj_params_avx2(const uint8_t *src8, int width, int height,
                               int src_stride, const uint8_t *dat8,
                               int dat_stride, int32_t *flt0, int flt0_stride,
                               int32_t *flt1, int flt1_stride, int64_t H[2][2],
                               int64_t C[2], const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_avx2(src8, width, height, src_stride, dat8,
                                dat_stride, flt0, flt0_stride, flt1,
                                flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt1, flt1_stride, H, C);
  }
}